

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecScale(axbVec_s *x,axbScalar_s *alpha)

{
  _func_axbStatus_t_axbVec_s_ptr_axbScalar_s_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  axbScalar_s *alpha_local;
  axbVec_s *x_local;
  
  op_desc._48_8_ = alpha;
  if (x->init == 0x1d232) {
    memcpy(&op,x->opBackend->op_table + 3,0x38);
    (*op)(x,(axbScalar_s *)op_desc._48_8_,op_desc.func);
    x_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    x_local._4_4_ = 0x1d232;
  }
  return x_local._4_4_;
}

Assistant:

axbStatus_t axbVecScale(struct axbVec_s *x, const struct axbScalar_s *alpha)
{
  AXB_VECTOR_INIT_CHECK(x);

  axbOpDescriptor_t op_desc = x->opBackend->op_table[AXB_OP_VEC_SCALE];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, void*)) op_desc.func;
  op(x, alpha, op_desc.func_data);
  return 0;
}